

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * Strsafe(char *y)

{
  uint uVar1;
  char cVar2;
  char *__s;
  FILE *data;
  size_t sVar3;
  long lVar4;
  char *extraout_RAX;
  char *extraout_RAX_00;
  char *pcVar5;
  uint *in_RCX;
  long extraout_RDX;
  uint uVar6;
  long in_RSI;
  FILE *__stream;
  
  if (y == (char *)0x0) {
    data = (FILE *)0x0;
  }
  else {
    __stream = (FILE *)y;
    data = (FILE *)Strsafe_find(y);
    if (data == (FILE *)0x0) {
      sVar3 = strlen(y);
      __stream = (FILE *)(long)((int)sVar3 + 1);
      data = (FILE *)malloc((size_t)__stream);
      if (data == (FILE *)0x0) {
        data = (FILE *)0x0;
      }
      else {
        lVar4 = 0;
        do {
          cVar2 = y[lVar4];
          in_RCX = (uint *)CONCAT71((int7)((ulong)in_RCX >> 8),cVar2);
          *(char *)((long)&data->_flags + lVar4) = cVar2;
          lVar4 = lVar4 + 1;
        } while (cVar2 != '\0');
        __stream = data;
        Strsafe_insert((char *)data);
      }
    }
    if (data == (FILE *)0x0) {
      Strsafe_cold_1();
      pcVar5 = extraout_RAX;
      if ((*(char **)(in_RSI + 0x40) != (char *)0x0) && (**(char **)(in_RSI + 0x40) != '\0')) {
        fprintf(__stream,"{%s");
        pcVar5 = *(char **)(in_RSI + 0x40);
        do {
          if (*pcVar5 == '\n') {
            *in_RCX = *in_RCX + 1;
          }
          else if (*pcVar5 == '\0') break;
          pcVar5 = pcVar5 + 1;
        } while( true );
      }
      if (*(long *)(in_RSI + 0x38) != 0) {
        if (*(int *)(extraout_RDX + 0x114) == 0) {
          *in_RCX = *in_RCX + 1;
          tplt_linedir((FILE *)__stream,*(int *)(in_RSI + 0x30),*(char **)(extraout_RDX + 0xe0));
        }
        fprintf(__stream,"{%s",*(undefined8 *)(in_RSI + 0x38));
        pcVar5 = *(char **)(in_RSI + 0x38);
        do {
          if (*pcVar5 == '\n') {
            *in_RCX = *in_RCX + 1;
          }
          else if (*pcVar5 == '\0') goto LAB_0010b7d3;
          pcVar5 = pcVar5 + 1;
        } while( true );
      }
      goto LAB_0010b813;
    }
  }
  return (char *)data;
LAB_0010b7d3:
  fwrite("}\n",2,1,__stream);
  uVar6 = *in_RCX;
  uVar1 = uVar6 + 1;
  pcVar5 = (char *)(ulong)uVar1;
  *in_RCX = uVar1;
  if (*(int *)(extraout_RDX + 0x114) == 0) {
    uVar6 = uVar6 + 2;
    *in_RCX = uVar6;
    tplt_linedir((FILE *)__stream,uVar6,*(char **)(extraout_RDX + 0xe8));
    pcVar5 = extraout_RAX_00;
  }
LAB_0010b813:
  __s = *(char **)(in_RSI + 0x48);
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    fputs(__s,__stream);
    pcVar5 = *(char **)(in_RSI + 0x48);
    do {
      if (*pcVar5 == '\n') {
        *in_RCX = *in_RCX + 1;
      }
      else if (*pcVar5 == '\0') break;
      pcVar5 = pcVar5 + 1;
    } while( true );
  }
  if (*(long *)(in_RSI + 0x40) != 0) {
    pcVar5 = (char *)fwrite("}\n",2,1,__stream);
    *in_RCX = *in_RCX + 1;
  }
  return pcVar5;
}

Assistant:

const char *Strsafe(const char *y)
{
  const char *z;
  char *cpy;

  if( y==0 ) return 0;
  z = Strsafe_find(y);
  if( z==0 && (cpy=(char *)malloc( lemonStrlen(y)+1 ))!=0 ){
    lemon_strcpy(cpy,y);
    z = cpy;
    Strsafe_insert(z);
  }
  MemoryCheck(z);
  return z;
}